

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
push<helics::ActionMessage>
          (BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this,
          ActionMessage *val)

{
  bool bVar1;
  value_type *in_RDI;
  bool *unaff_retaddr;
  atomic<bool> *in_stack_00000008;
  unique_lock<std::mutex> pullLock;
  bool expEmpty;
  unique_lock<std::mutex> pushLock;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar2;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_stack_ffffffffffffffc0;
  value_type *pvVar3;
  
  pvVar3 = in_RDI;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(mutex_type *)in_RDI);
  bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                    (in_stack_ffffffffffffffc0);
  if (bVar1) {
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_00000008,unaff_retaddr,SUB81((ulong)pvVar3 >> 0x38,0),
                       (memory_order)pvVar3);
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock
                ((unique_lock<std::mutex> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),(mutex_type *)in_RDI)
      ;
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 SUB81((ulong)in_RDI >> 0x38,0));
      bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                        (in_stack_ffffffffffffffc0);
      if (bVar1) {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
      }
      else {
        std::unique_lock<std::mutex>::lock
                  ((unique_lock<std::mutex> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
      }
      std::condition_variable::notify_all();
      uVar2 = 1;
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)CONCAT44(1,in_stack_ffffffffffffffb0));
    }
    else {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        (in_stack_00000008,unaff_retaddr,SUB81((ulong)pvVar3 >> 0x38,0),
                         (memory_order)pvVar3);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
      uVar2 = 1;
    }
  }
  else {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
    uVar2 = 0;
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT44(uVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void push(Z&& val)  // forwarding reference
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;
                    if (pullElements.empty()) {
                        pullElements.push_back(std::forward<Z>(val));
                    } else {
                        pushLock.lock();
                        pushElements.push_back(std::forward<Z>(val));
                    }
                    // pullLock.unlock ();
                    condition.notify_all();
                    return;
                } else {
                    pushElements.push_back(std::forward<Z>(val));
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.push_back(std::forward<Z>(val));
        }